

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::
Span<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
::freeData(Span<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
           *this)

{
  byte bVar1;
  MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *pMVar2;
  MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *local_18;
  
  if (in_RDI[8].key != 0) {
    pMVar2 = in_RDI + 8;
    for (local_18 = in_RDI; local_18 != pMVar2;
        local_18 = (MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>
                    *)((long)&local_18->key + 1)) {
      bVar1 = (byte)local_18->key;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[8].key + (ulong)bVar1 * 0x10));
        MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::~MultiNode
                  (in_RDI);
      }
    }
    if ((void *)in_RDI[8].key != (void *)0x0) {
      operator_delete__((void *)in_RDI[8].key);
    }
    in_RDI[8].key = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }